

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

UpdateInfo *
duckdb::CreateEmptyUpdateInfo
          (TransactionData transaction,idx_t type_size,idx_t count,unsafe_unique_array<char> *data)

{
  _Head_base<0UL,_char_*,_false> _Var1;
  _Head_base<0UL,_char_*,_false> _Var2;
  
  _Var2._M_head_impl = (char *)operator_new__(type_size * 0x800 + 0x204f & 0xfffffffffffff848);
  _Var1._M_head_impl =
       (data->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  (data->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (char *)0x0) {
    operator_delete__(_Var1._M_head_impl);
  }
  _Var1._M_head_impl =
       (data->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  *(sel_t *)(_Var1._M_head_impl + 0x24) = 0x800;
  LOCK();
  (((atomic<unsigned_long> *)(_Var1._M_head_impl + 0x10))->super___atomic_base<unsigned_long>)._M_i
       = transaction.transaction_id;
  UNLOCK();
  _Var1._M_head_impl[0] = '\0';
  _Var1._M_head_impl[1] = '\0';
  _Var1._M_head_impl[2] = '\0';
  _Var1._M_head_impl[3] = '\0';
  _Var1._M_head_impl[4] = '\0';
  _Var1._M_head_impl[5] = '\0';
  _Var1._M_head_impl[6] = '\0';
  _Var1._M_head_impl[7] = '\0';
  ((UndoBufferPointer *)(_Var1._M_head_impl + 0x28))->entry = (UndoBufferEntry *)0x0;
  ((UndoBufferPointer *)(_Var1._M_head_impl + 0x38))->entry = (UndoBufferEntry *)0x0;
  return (UpdateInfo *)_Var1._M_head_impl;
}

Assistant:

UpdateInfo *CreateEmptyUpdateInfo(TransactionData transaction, idx_t type_size, idx_t count,
                                  unsafe_unique_array<char> &data) {
	data = make_unsafe_uniq_array_uninitialized<char>(UpdateInfo::GetAllocSize(type_size));
	auto update_info = reinterpret_cast<UpdateInfo *>(data.get());
	UpdateInfo::Initialize(*update_info, transaction.transaction_id);
	return update_info;
}